

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolitaireTests.cpp
# Opt level: O2

void __thiscall
solitaire::SolitaireEmptyHandTest::ignoreEmptyHandPossibleOperationsTest
          (SolitaireEmptyHandTest *this)

{
  TypedExpectation<unsigned_int_()> *this_00;
  TypedExpectation<void_()> *pTVar1;
  TypedExpectation<std::optional<solitaire::cards::Card>_()> *pTVar2;
  TypedExpectation<bool_()> *this_01;
  TypedExpectation<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
  *this_02;
  TypedExpectation<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
  *this_03;
  Solitaire *this_04;
  HistoryTrackerMock *in_RSI;
  HistoryTrackerMock *this_05;
  FoundationPileMock *this_06;
  TableauPileMock *pTVar3;
  StockPileMock *pSVar4;
  MockSpec<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
  local_68;
  PileId local_44;
  PileId local_40;
  PileId local_3c;
  MatcherBase<unsigned_int> local_38;
  
  local_68.function_mocker_ =
       (FunctionMocker<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
        *)archivers::HistoryTrackerMock::gmock_getHistorySize
                    ((MockSpec<unsigned_int_()> *)
                     (this->super_SolitaireTest).historyTrackerMock.rawPointer,in_RSI);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<unsigned_int_()>::InternalExpectedAt
                      ((MockSpec<unsigned_int_()> *)&local_68,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
                       ,0xaf,"*historyTrackerMock","getHistorySize()");
  this_05 = (HistoryTrackerMock *)0x0;
  testing::internal::TypedExpectation<unsigned_int_()>::Times(this_00,0);
  local_68.function_mocker_ =
       (FunctionMocker<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
        *)archivers::HistoryTrackerMock::gmock_undo
                    ((MockSpec<void_()> *)(this->super_SolitaireTest).historyTrackerMock.rawPointer,
                     this_05);
  testing::internal::GetWithoutMatchers();
  pTVar1 = testing::internal::MockSpec<void_()>::InternalExpectedAt
                     ((MockSpec<void_()> *)&local_68,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
                      ,0xb0,"*historyTrackerMock","undo()");
  this_06 = (FoundationPileMock *)0x0;
  testing::internal::TypedExpectation<void_()>::Times(pTVar1,0);
  local_68.function_mocker_ =
       (FunctionMocker<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
        *)piles::FoundationPileMock::gmock_tryPullOutCard
                    ((MockSpec<std::optional<solitaire::cards::Card>_()> *)
                     (this->super_SolitaireTest).lastFoundationPileMock,this_06);
  testing::internal::GetWithoutMatchers();
  pTVar2 = testing::internal::MockSpec<std::optional<solitaire::cards::Card>_()>::InternalExpectedAt
                     ((MockSpec<std::optional<solitaire::cards::Card>_()> *)&local_68,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
                      ,0xb1,"lastFoundationPileMock","tryPullOutCard()");
  pTVar3 = (TableauPileMock *)0x0;
  testing::internal::TypedExpectation<std::optional<solitaire::cards::Card>_()>::Times(pTVar2,0);
  local_68.function_mocker_ =
       (FunctionMocker<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
        *)piles::TableauPileMock::gmock_isTopCardCovered
                    ((MockSpec<bool_()> *)(this->super_SolitaireTest).lastTableauPileMock,pTVar3);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::MockSpec<bool_()>::InternalExpectedAt
                      ((MockSpec<bool_()> *)&local_68,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
                       ,0xb2,"lastTableauPileMock","isTopCardCovered()");
  pTVar3 = (TableauPileMock *)0x0;
  testing::internal::TypedExpectation<bool_()>::Times(this_01,0);
  local_68.function_mocker_ =
       (FunctionMocker<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
        *)piles::TableauPileMock::gmock_tryUncoverTopCard
                    ((MockSpec<void_()> *)(this->super_SolitaireTest).lastTableauPileMock,pTVar3);
  testing::internal::GetWithoutMatchers();
  pTVar1 = testing::internal::MockSpec<void_()>::InternalExpectedAt
                     ((MockSpec<void_()> *)&local_68,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
                      ,0xb3,"lastTableauPileMock","tryUncoverTopCard()");
  testing::internal::TypedExpectation<void_()>::Times(pTVar1,0);
  local_38.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<unsigned_int>::
       GetVTable<testing::internal::MatcherBase<unsigned_int>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_38.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_002e9520;
  piles::TableauPileMock::gmock_tryPullOutCards
            (&local_68,(this->super_SolitaireTest).lastTableauPileMock,
             (Matcher<unsigned_int> *)&local_38);
  testing::internal::GetWithoutMatchers();
  this_02 = testing::internal::
            MockSpec<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
            ::InternalExpectedAt
                      (&local_68,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
                       ,0xb4,"lastTableauPileMock","tryPullOutCards(_)");
  pSVar4 = (StockPileMock *)0x0;
  testing::internal::
  TypedExpectation<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
  ::Times(this_02,0);
  testing::internal::MatcherBase<unsigned_int>::~MatcherBase
            ((MatcherBase<unsigned_int> *)&local_68.matchers_);
  testing::internal::MatcherBase<unsigned_int>::~MatcherBase(&local_38);
  local_68.function_mocker_ =
       (FunctionMocker<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
        *)piles::StockPileMock::gmock_getCards
                    ((MockSpec<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
                      *)(this->super_SolitaireTest).stockPileMock.
                        super___shared_ptr<solitaire::piles::StockPileMock,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr,pSVar4);
  testing::internal::GetWithoutMatchers();
  this_03 = testing::internal::
            MockSpec<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
            ::InternalExpectedAt
                      ((MockSpec<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
                        *)&local_68,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
                       ,0xb5,"*stockPileMock","getCards()");
  pSVar4 = (StockPileMock *)0x0;
  testing::internal::
  TypedExpectation<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
  ::Times(this_03,0);
  local_68.function_mocker_ =
       (FunctionMocker<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
        *)piles::StockPileMock::gmock_trySelectNextCard
                    ((MockSpec<void_()> *)
                     (this->super_SolitaireTest).stockPileMock.
                     super___shared_ptr<solitaire::piles::StockPileMock,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,pSVar4);
  testing::internal::GetWithoutMatchers();
  pTVar1 = testing::internal::MockSpec<void_()>::InternalExpectedAt
                     ((MockSpec<void_()> *)&local_68,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
                      ,0xb6,"*stockPileMock","trySelectNextCard()");
  pSVar4 = (StockPileMock *)0x0;
  testing::internal::TypedExpectation<void_()>::Times(pTVar1,0);
  local_68.function_mocker_ =
       (FunctionMocker<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
        *)piles::StockPileMock::gmock_tryPullOutCard
                    ((MockSpec<std::optional<solitaire::cards::Card>_()> *)
                     (this->super_SolitaireTest).stockPileMock.
                     super___shared_ptr<solitaire::piles::StockPileMock,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,pSVar4);
  testing::internal::GetWithoutMatchers();
  pTVar2 = testing::internal::MockSpec<std::optional<solitaire::cards::Card>_()>::InternalExpectedAt
                     ((MockSpec<std::optional<solitaire::cards::Card>_()> *)&local_68,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
                      ,0xb7,"*stockPileMock","tryPullOutCard()");
  testing::internal::TypedExpectation<std::optional<solitaire::cards::Card>_()>::Times(pTVar2,0);
  this_04 = &(this->super_SolitaireTest).solitaire;
  Solitaire::tryUndoOperation(this_04);
  local_3c.t = (anonymous_namespace)::lastFoundationPileId;
  Solitaire::tryPullOutCardFromFoundationPile(this_04,&local_3c);
  local_40.t = (anonymous_namespace)::lastTableauPileId;
  Solitaire::tryUncoverTableauPileTopCard(this_04,&local_40);
  local_44.t = (anonymous_namespace)::lastTableauPileId;
  Solitaire::tryPullOutCardsFromTableauPile(this_04,&local_44,2);
  Solitaire::trySelectNextStockPileCard(this_04);
  Solitaire::tryPullOutCardFromStockPile(this_04);
  return;
}

Assistant:

void ignoreEmptyHandPossibleOperationsTest() {
        EXPECT_CALL(*historyTrackerMock, getHistorySize()).Times(0);
        EXPECT_CALL(*historyTrackerMock, undo()).Times(0);
        EXPECT_CALL(lastFoundationPileMock, tryPullOutCard()).Times(0);
        EXPECT_CALL(lastTableauPileMock, isTopCardCovered()).Times(0);
        EXPECT_CALL(lastTableauPileMock, tryUncoverTopCard()).Times(0);
        EXPECT_CALL(lastTableauPileMock, tryPullOutCards(_)).Times(0);
        EXPECT_CALL(*stockPileMock, getCards()).Times(0);
        EXPECT_CALL(*stockPileMock, trySelectNextCard()).Times(0);
        EXPECT_CALL(*stockPileMock, tryPullOutCard()).Times(0);

        solitaire.tryUndoOperation();
        solitaire.tryPullOutCardFromFoundationPile(lastFoundationPileId);
        solitaire.tryUncoverTableauPileTopCard(lastTableauPileId);
        solitaire.tryPullOutCardsFromTableauPile(lastTableauPileId, quantityToPullOut);
        solitaire.trySelectNextStockPileCard();
        solitaire.tryPullOutCardFromStockPile();
    }